

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O3

int Fxch_DivRemoveLits(Vec_Int_t *vCube0,Vec_Int_t *vCube1,Vec_Int_t *vDiv,int *fCompl)

{
  int *piVar1;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  int local_3c;
  
  if (vDiv->nSize < 1) {
    iVar4 = 0;
    local_3c = 0;
  }
  else {
    piVar1 = vDiv->pArray;
    lVar9 = 0;
    iVar4 = 0;
    local_3c = 0;
    do {
      uVar6 = piVar1[lVar9];
      if ((int)uVar6 < 0) goto LAB_004c5cc3;
      uVar10 = vCube0->nSize;
      iVar8 = 0;
      if ((uVar6 & 2) == 0) {
        if (1 < (int)uVar10) {
          piVar2 = vCube0->pArray;
          uVar7 = 2;
LAB_004c58b3:
          if (piVar2[uVar7 - 1] != uVar6 >> 1) goto code_r0x004c58ba;
          if ((int)uVar7 < (int)uVar10) {
            do {
              piVar2[uVar7 - 1] = piVar2[uVar7];
              uVar7 = uVar7 + 1;
              uVar10 = vCube0->nSize;
            } while ((int)uVar7 < (int)uVar10);
          }
          vCube0->nSize = uVar10 - 1;
          iVar8 = 1;
        }
LAB_004c5924:
        iVar4 = iVar4 + iVar8;
      }
      else {
        if (1 < (int)uVar10) {
          piVar2 = vCube0->pArray;
          uVar7 = 2;
LAB_004c58e5:
          if (piVar2[uVar7 - 1] != uVar6 >> 1) goto code_r0x004c58ec;
          if ((int)uVar7 < (int)uVar10) {
            do {
              piVar2[uVar7 - 1] = piVar2[uVar7];
              uVar7 = uVar7 + 1;
              uVar10 = vCube0->nSize;
            } while ((int)uVar7 < (int)uVar10);
          }
          vCube0->nSize = uVar10 - 1;
          iVar8 = 1;
        }
LAB_004c594e:
        local_3c = local_3c + iVar8;
      }
      lVar9 = lVar9 + 1;
      uVar7 = (ulong)vDiv->nSize;
    } while (lVar9 < (long)uVar7);
    if (0 < vDiv->nSize) {
      piVar1 = vDiv->pArray;
      lVar9 = 0;
      iVar8 = 0;
      do {
        if (piVar1[lVar9] < 0) goto LAB_004c5cc3;
        iVar5 = vCube1->nSize;
        iVar11 = 0;
        if (1 < (long)iVar5) {
          piVar2 = vCube1->pArray;
          lVar12 = 2;
LAB_004c59a8:
          if (piVar2[lVar12 + -1] != (uint)piVar1[lVar9] >> 1) goto code_r0x004c59af;
          if ((int)lVar12 < iVar5) {
            do {
              piVar2[lVar12 + -1] = piVar2[lVar12];
              lVar12 = lVar12 + 1;
              iVar5 = vCube1->nSize;
            } while ((int)lVar12 < iVar5);
          }
          vCube1->nSize = iVar5 + -1;
          uVar7 = (ulong)(uint)vDiv->nSize;
          iVar11 = 1;
        }
LAB_004c59ea:
        iVar8 = iVar8 + iVar11;
        lVar9 = lVar9 + 1;
        iVar5 = (int)uVar7;
      } while (lVar9 < iVar5);
      if (iVar5 == 2) {
        piVar1 = vDiv->pArray;
        lVar9 = 0;
        do {
          if (piVar1[lVar9] < 0) goto LAB_004c5cc3;
          uVar6 = (uint)piVar1[lVar9] >> 1 ^ 1;
          iVar5 = vCube0->nSize;
          if (1 < (long)iVar5) {
            piVar2 = vCube0->pArray;
            lVar12 = 2;
LAB_004c5a36:
            if (piVar2[lVar12 + -1] != uVar6) goto code_r0x004c5a3d;
            if ((int)lVar12 < iVar5) {
              do {
                piVar2[lVar12 + -1] = piVar2[lVar12];
                lVar12 = lVar12 + 1;
                iVar5 = vCube0->nSize;
              } while ((int)lVar12 < iVar5);
            }
            vCube0->nSize = iVar5 + -1;
          }
LAB_004c5a70:
          iVar5 = vCube1->nSize;
          if (1 < (long)iVar5) {
            piVar2 = vCube1->pArray;
            lVar12 = 2;
LAB_004c5a8d:
            if (piVar2[lVar12 + -1] != uVar6) goto code_r0x004c5a94;
            if ((int)lVar12 < iVar5) {
              do {
                piVar2[lVar12 + -1] = piVar2[lVar12];
                lVar12 = lVar12 + 1;
                iVar5 = vCube1->nSize;
              } while ((int)lVar12 < iVar5);
            }
            vCube1->nSize = iVar5 + -1;
          }
LAB_004c5ac7:
          lVar9 = lVar9 + 1;
          iVar5 = vDiv->nSize;
        } while (lVar9 < iVar5);
      }
      iVar8 = iVar4 + local_3c + iVar8;
      if (iVar5 != 4) {
        return iVar8;
      }
      puVar3 = (uint *)vDiv->pArray;
      if ((((-1 < (int)*puVar3) && (-1 < (int)puVar3[1])) && (-1 < (int)puVar3[2])) &&
         (-1 < (int)puVar3[3])) {
        if (((puVar3[1] ^ *puVar3) & 0x7ffffffe) != 2) {
          return iVar8;
        }
        if (local_3c == 1 && ((puVar3[3] ^ puVar3[2]) & 0x7ffffffe) == 2) {
          *fCompl = 1;
        }
        if (iVar8 != 2) {
          return iVar8;
        }
        *fCompl = 1;
        iVar4 = vDiv->nSize;
        iVar8 = 2;
        if (iVar4 < 1) {
          return 2;
        }
        uVar7 = 0;
        do {
          if ((int)puVar3[uVar7] < 0) goto LAB_004c5cc3;
          iVar5 = vCube0->nSize;
          iVar11 = 0;
          if (1 < (long)iVar5) {
            piVar1 = vCube0->pArray;
            lVar9 = 2;
LAB_004c5bb4:
            if (piVar1[lVar9 + -1] != ((uint)(1 < uVar7) ^ puVar3[uVar7] >> 1))
            goto code_r0x004c5bbb;
            if ((int)lVar9 < iVar5) {
              do {
                piVar1[lVar9 + -1] = piVar1[lVar9];
                lVar9 = lVar9 + 1;
                iVar5 = vCube0->nSize;
              } while ((int)lVar9 < iVar5);
            }
            vCube0->nSize = iVar5 + -1;
            iVar4 = vDiv->nSize;
            iVar11 = 1;
          }
LAB_004c5bf7:
          iVar8 = iVar8 + iVar11;
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)iVar4);
        if (iVar4 < 1) {
          return iVar8;
        }
        uVar7 = 0;
        while (-1 < (int)puVar3[uVar7]) {
          iVar5 = vCube1->nSize;
          iVar11 = 0;
          if (1 < (long)iVar5) {
            piVar1 = vCube1->pArray;
            lVar9 = 2;
LAB_004c5c51:
            if (piVar1[lVar9 + -1] != ((uint)(1 < uVar7) ^ puVar3[uVar7] >> 1))
            goto code_r0x004c5c58;
            if ((int)lVar9 < iVar5) {
              do {
                piVar1[lVar9 + -1] = piVar1[lVar9];
                lVar9 = lVar9 + 1;
                iVar5 = vCube1->nSize;
              } while ((int)lVar9 < iVar5);
            }
            vCube1->nSize = iVar5 + -1;
            iVar4 = vDiv->nSize;
            iVar11 = 1;
          }
LAB_004c5c94:
          iVar8 = iVar8 + iVar11;
          uVar7 = uVar7 + 1;
          if ((long)iVar4 <= (long)uVar7) {
            return iVar8;
          }
        }
      }
LAB_004c5cc3:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
  }
  return iVar4 + local_3c;
code_r0x004c58ec:
  bVar13 = uVar7 == uVar10;
  uVar7 = uVar7 + 1;
  if (bVar13) goto LAB_004c594e;
  goto LAB_004c58e5;
code_r0x004c58ba:
  bVar13 = uVar7 == uVar10;
  uVar7 = uVar7 + 1;
  if (bVar13) goto LAB_004c5924;
  goto LAB_004c58b3;
code_r0x004c59af:
  bVar13 = lVar12 == iVar5;
  lVar12 = lVar12 + 1;
  iVar11 = 0;
  if (bVar13) goto LAB_004c59ea;
  goto LAB_004c59a8;
code_r0x004c5a3d:
  bVar13 = lVar12 == iVar5;
  lVar12 = lVar12 + 1;
  if (bVar13) goto LAB_004c5a70;
  goto LAB_004c5a36;
code_r0x004c5a94:
  bVar13 = lVar12 == iVar5;
  lVar12 = lVar12 + 1;
  if (bVar13) goto LAB_004c5ac7;
  goto LAB_004c5a8d;
code_r0x004c5bbb:
  bVar13 = lVar9 == iVar5;
  lVar9 = lVar9 + 1;
  if (bVar13) goto LAB_004c5bf7;
  goto LAB_004c5bb4;
code_r0x004c5c58:
  bVar13 = lVar9 == iVar5;
  lVar9 = lVar9 + 1;
  iVar11 = 0;
  if (bVar13) goto LAB_004c5c94;
  goto LAB_004c5c51;
}

Assistant:

int Fxch_DivRemoveLits( Vec_Int_t* vCube0,
                        Vec_Int_t* vCube1,
                        Vec_Int_t* vDiv,
                        int *fCompl )
{
    int i,
        Lit,
        CountP = 0,
        CountN = 0,
        Count = 0,
        ret = 0;

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Abc_Lit2Var( Lit ) ) )
            CountN += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );
        else
            CountP += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        Count += Vec_IntRemove1( vCube1, Abc_Lit2Var( Lit ) );

   if ( Vec_IntSize( vDiv ) == 2 )
       Vec_IntForEachEntry( vDiv, Lit, i )
       {
           Vec_IntRemove1( vCube0, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
           Vec_IntRemove1( vCube1, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
       }

    ret = Count + CountP + CountN;

    if ( Vec_IntSize( vDiv ) == 4 )
    {
        int Lit0 = Abc_Lit2Var( Vec_IntEntry( vDiv, 0 ) ),
            Lit1 = Abc_Lit2Var( Vec_IntEntry( vDiv, 1 ) ),
            Lit2 = Abc_Lit2Var( Vec_IntEntry( vDiv, 2 ) ),
            Lit3 = Abc_Lit2Var( Vec_IntEntry( vDiv, 3 ) );

        if ( Lit0 == Abc_LitNot( Lit1 ) && Lit2 == Abc_LitNot( Lit3 ) && CountN == 1 )
            *fCompl = 1;

        if ( Lit0 == Abc_LitNot( Lit1 ) && ret == 2 )
        {
            *fCompl = 1;

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube0, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube1, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );
        }
    }

    return ret;
}